

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

uint64_t unpackLE64(uint8_t *p,uint8_t u8Size)

{
  uint8_t *local_28;
  uint64_t value;
  uint8_t *puStack_18;
  uint8_t u8Size_local;
  uint8_t *p_local;
  
  if ((u8Size == '\0') || (8 < u8Size)) {
    p_local = (uint8_t *)0x0;
  }
  else {
    local_28 = (uint8_t *)0x0;
    value._7_1_ = u8Size;
    puStack_18 = p;
    memcpy(&local_28,p,(ulong)u8Size);
    p_local = local_28;
  }
  return (uint64_t)p_local;
}

Assistant:

_PACK_UINT64 unpackLE64(const _PACK_UINT8* p, _PACK_UINT8 u8Size)
{
   if ((u8Size > 0) && (u8Size <= sizeof(_PACK_UINT64)))
   {
#if defined(PLATFORM_BYTE_ORDER) && (PLATFORM_BYTE_ORDER==PLATFORM_LITTLE_ENDIAN)
      _PACK_UINT64 value = 0u;
      memcpy(&value, p, u8Size);
      return value;
#else
      _PACK_UINT64 tmp = 0;
      p += (u8Size - 1);
      while (u8Size > 0)
      {
         tmp = (tmp << 8) | *(p--);
         u8Size--;
      }
      return tmp;
#endif
   }
   return 0;
}